

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
either<toml::detail::sequence<toml::detail::character<'"'>,_toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'"'>,_toml::detail::character<'\\'>,_toml::detail::character<'\x7f'>_>_>,_toml::detail::sequence<toml::detail::character<'\\'>,_toml::detail::either<toml::detail::character<'"'>,_toml::detail::character<'\\'>,_toml::detail::character<'b'>,_toml::detail::character<'f'>,_toml::detail::character<'n'>,_toml::detail::character<'r'>,_toml::detail::character<'t'>,_toml::detail::sequence<toml::detail::character<'u'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<4UL>_>_>,_toml::detail::sequence<toml::detail::character<'U'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<8UL>_>_>_>_>_>,_toml::detail::unlimited>,_toml::detail::character<'"'>_>,_toml::detail::sequence<toml::detail::character<'\''>,_toml::detail::repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'\x7f'>,_toml::detail::character<'\''>_>_>,_toml::detail::unlimited>,_toml::detail::character<'\''>_>_>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  result<toml::detail::region,_toml::detail::none_t> *prVar1;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  result<toml::detail::region,_toml::detail::none_t> local_68;
  
  prVar1 = &local_68;
  sequence<toml::detail::character<'"'>,_toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'"'>,_toml::detail::character<'\\'>,_toml::detail::character<'\x7f'>_>_>,_toml::detail::sequence<toml::detail::character<'\\'>,_toml::detail::either<toml::detail::character<'"'>,_toml::detail::character<'\\'>,_toml::detail::character<'b'>,_toml::detail::character<'f'>,_toml::detail::character<'n'>,_toml::detail::character<'r'>,_toml::detail::character<'t'>,_toml::detail::sequence<toml::detail::character<'u'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<4UL>_>_>,_toml::detail::sequence<toml::detail::character<'U'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<8UL>_>_>_>_>_>,_toml::detail::unlimited>,_toml::detail::character<'"'>_>
  ::invoke(&local_68,loc);
  if (local_68.is_ok_ == true) {
    result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_68);
    loc = (location *)prVar1;
  }
  else {
    sequence<toml::detail::character<'\''>,_toml::detail::repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'\x7f'>,_toml::detail::character<'\''>_>_>,_toml::detail::unlimited>,_toml::detail::character<'\''>_>
    ::invoke(__return_storage_ptr__,loc);
  }
  result<toml::detail::region,_toml::detail::none_t>::cleanup(&local_68,(EVP_PKEY_CTX *)loc);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_ok()) {return rslt;}
        return either<Tail...>::invoke(loc);
    }